

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

void vkt::SpirVAssembly::createUConvertCases
               (vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
                *testCases)

{
  vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_> *pvVar1;
  ConvertCase local_320;
  ConvertCase local_2a0;
  ConvertCase local_220;
  ConvertCase local_1a0;
  ConvertCase local_120;
  ConvertCase local_90;
  vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  *local_10;
  vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>
  *testCases_local;
  
  local_10 = testCases;
  ConvertCase::ConvertCase(&local_90,INTEGER_TYPE_UNSIGNED_16,INTEGER_TYPE_UNSIGNED_32,0xeced);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  push_back(testCases,&local_90);
  ConvertCase::~ConvertCase(&local_90);
  pvVar1 = local_10;
  ConvertCase::ConvertCase(&local_120,INTEGER_TYPE_UNSIGNED_16,INTEGER_TYPE_UNSIGNED_64,0x4647);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  push_back(pvVar1,&local_120);
  ConvertCase::~ConvertCase(&local_120);
  pvVar1 = local_10;
  ConvertCase::ConvertCase(&local_1a0,INTEGER_TYPE_UNSIGNED_32,INTEGER_TYPE_UNSIGNED_64,0x35e5db13);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  push_back(pvVar1,&local_1a0);
  ConvertCase::~ConvertCase(&local_1a0);
  pvVar1 = local_10;
  ConvertCase::ConvertCase(&local_220,INTEGER_TYPE_UNSIGNED_16,INTEGER_TYPE_SIGNED_32,0x9472);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  push_back(pvVar1,&local_220);
  ConvertCase::~ConvertCase(&local_220);
  pvVar1 = local_10;
  ConvertCase::ConvertCase(&local_2a0,INTEGER_TYPE_UNSIGNED_16,INTEGER_TYPE_SIGNED_64,0xfd99);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  push_back(pvVar1,&local_2a0);
  ConvertCase::~ConvertCase(&local_2a0);
  pvVar1 = local_10;
  ConvertCase::ConvertCase(&local_320,INTEGER_TYPE_UNSIGNED_32,INTEGER_TYPE_SIGNED_64,0xffffd507);
  std::vector<vkt::SpirVAssembly::ConvertCase,_std::allocator<vkt::SpirVAssembly::ConvertCase>_>::
  push_back(pvVar1,&local_320);
  ConvertCase::~ConvertCase(&local_320);
  return;
}

Assistant:

void createUConvertCases (vector<ConvertCase>& testCases)
{
	// Convert unsigned int to unsigned int
	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_16,	INTEGER_TYPE_UNSIGNED_32,	60653));
	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_16,	INTEGER_TYPE_UNSIGNED_64,	17991));

	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_32,	INTEGER_TYPE_UNSIGNED_64,	904256275));

	// Convert unsigned int to int
	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_16,	INTEGER_TYPE_SIGNED_32,		38002));
	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_16,	INTEGER_TYPE_SIGNED_64,		64921));

	testCases.push_back(ConvertCase(INTEGER_TYPE_UNSIGNED_32,	INTEGER_TYPE_SIGNED_64,		4294956295ll));
}